

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::InnerProductParameter::SharedCtor(InnerProductParameter *this)

{
  *(undefined8 *)((long)&this->weight_filler_ + 5) = 0;
  *(undefined8 *)((long)&this->bias_filler_ + 5) = 0;
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&this->weight_filler_ + 4) = 0;
  this->bias_term_ = true;
  this->axis_ = 1;
  return;
}

Assistant:

void InnerProductParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&weight_filler_, 0, reinterpret_cast<char*>(&transpose_) -
    reinterpret_cast<char*>(&weight_filler_) + sizeof(transpose_));
  bias_term_ = true;
  axis_ = 1;
}